

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3Fts3EvalPhraseCleanup(Fts3Phrase *pPhrase)

{
  int local_14;
  int i;
  Fts3Phrase *pPhrase_local;
  
  if (pPhrase != (Fts3Phrase *)0x0) {
    sqlite3_free((pPhrase->doclist).aAll);
    fts3EvalInvalidatePoslist(pPhrase);
    memset(pPhrase,0,0x38);
    for (local_14 = 0; local_14 < pPhrase->nToken; local_14 = local_14 + 1) {
      fts3SegReaderCursorFree(pPhrase->aToken[local_14].pSegcsr);
      pPhrase->aToken[local_14].pSegcsr = (Fts3MultiSegReader *)0x0;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3Fts3EvalPhraseCleanup(Fts3Phrase *pPhrase){
  if( pPhrase ){
    int i;
    sqlite3_free(pPhrase->doclist.aAll);
    fts3EvalInvalidatePoslist(pPhrase);
    memset(&pPhrase->doclist, 0, sizeof(Fts3Doclist));
    for(i=0; i<pPhrase->nToken; i++){
      fts3SegReaderCursorFree(pPhrase->aToken[i].pSegcsr);
      pPhrase->aToken[i].pSegcsr = 0;
    }
  }
}